

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_compiled.hpp
# Opt level: O0

void __thiscall
defyx::CompiledVm<defyx::LargePageAllocator,_true>::CompiledVm
          (CompiledVm<defyx::LargePageAllocator,_true> *this)

{
  VmBase<defyx::LargePageAllocator,_true> *in_RDI;
  JitCompilerX86 *unaff_retaddr;
  
  VmBase<defyx::LargePageAllocator,_true>::VmBase(in_RDI);
  (in_RDI->super_defyx_vm)._vptr_defyx_vm = (_func_int **)&PTR__CompiledVm_00168ad0;
  JitCompilerX86::JitCompilerX86(unaff_retaddr);
  return;
}

Assistant:

void* operator new(size_t size) {
			void* ptr = AlignedAllocator<CacheLineSize>::allocMemory(size);
			if (ptr == nullptr)
				throw std::bad_alloc();
			return ptr;
		}